

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O3

void Gia_PolynCoreCollect_rec(Gia_Man_t *pGia,int iObj,Vec_Int_t *vNodes,Vec_Bit_t *vVisited)

{
  uint uVar1;
  
  if (-1 < iObj) {
    if (iObj < vVisited->nSize) {
      uVar1 = vVisited->pArray[(uint)iObj >> 5];
      if ((uVar1 >> (iObj & 0x1fU) & 1) != 0) {
        return;
      }
      vVisited->pArray[(uint)iObj >> 5] = uVar1 | 1 << ((byte)iObj & 0x1f);
      if (iObj < pGia->nObjs) {
        Gia_PolynCoreCollect_rec
                  (pGia,iObj - (*(uint *)(pGia->pObjs + (uint)iObj) & 0x1fffffff),vNodes,vVisited);
        if (iObj < pGia->nObjs) {
          Gia_PolynCoreCollect_rec
                    (pGia,iObj - (*(uint *)&pGia->pObjs[(uint)iObj].field_0x4 & 0x1fffffff),vNodes,
                     vVisited);
          Vec_IntPush(vNodes,iObj);
          return;
        }
      }
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
}

Assistant:

void Gia_PolynCoreCollect_rec( Gia_Man_t * pGia, int iObj, Vec_Int_t * vNodes, Vec_Bit_t * vVisited )
{
    if ( Vec_BitEntry(vVisited, iObj) )
        return;
    Vec_BitSetEntry( vVisited, iObj, 1 );
    Gia_PolynCoreCollect_rec( pGia, Gia_ObjFaninId0p(pGia, Gia_ManObj(pGia, iObj)), vNodes, vVisited );
    Gia_PolynCoreCollect_rec( pGia, Gia_ObjFaninId1p(pGia, Gia_ManObj(pGia, iObj)), vNodes, vVisited );
    Vec_IntPush( vNodes, iObj );
}